

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_joy.cpp
# Opt level: O3

bool M_LoadJoystickConfig(IJoystickConfig *joy)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char *buffer;
  ulong uVar6;
  size_t count;
  double dVar7;
  char key [32];
  char local_58 [40];
  
  (*joy->_vptr_IJoystickConfig[0x11])();
  bVar1 = M_SetJoystickConfigSection(joy,false);
  if (bVar1) {
    pcVar5 = FConfigFile::GetValueForKey(&GameConfig->super_FConfigFile,"Sensitivity");
    if (pcVar5 != (char *)0x0) {
      dVar7 = atof(pcVar5);
      (*joy->_vptr_IJoystickConfig[4])(CONCAT44((int)((ulong)dVar7 >> 0x20),(float)dVar7),joy);
    }
    uVar2 = (*joy->_vptr_IJoystickConfig[5])(joy);
    if (0 < (int)uVar2) {
      uVar6 = 0;
      do {
        iVar3 = mysnprintf(local_58,0x20,"Axis%u",uVar6);
        buffer = local_58 + iVar3;
        count = 0x20 - (long)iVar3;
        mysnprintf(buffer,count,"deadzone");
        pcVar5 = FConfigFile::GetValueForKey(&GameConfig->super_FConfigFile,local_58);
        if (pcVar5 != (char *)0x0) {
          dVar7 = atof(pcVar5);
          (*joy->_vptr_IJoystickConfig[10])
                    (CONCAT44((int)((ulong)dVar7 >> 0x20),(float)dVar7),joy,uVar6);
        }
        mysnprintf(buffer,count,"scale");
        pcVar5 = FConfigFile::GetValueForKey(&GameConfig->super_FConfigFile,local_58);
        if (pcVar5 != (char *)0x0) {
          dVar7 = atof(pcVar5);
          (*joy->_vptr_IJoystickConfig[0xc])
                    (CONCAT44((int)((ulong)dVar7 >> 0x20),(float)dVar7),joy,uVar6);
        }
        mysnprintf(buffer,count,"map");
        pcVar5 = FConfigFile::GetValueForKey(&GameConfig->super_FConfigFile,local_58);
        if (pcVar5 != (char *)0x0) {
          uVar4 = atoi(pcVar5);
          if (uVar4 - 5 < 0xfffffffa) {
            uVar4 = 0xffffffff;
          }
          (*joy->_vptr_IJoystickConfig[0xb])(joy,uVar6,(ulong)uVar4);
        }
        uVar4 = (int)uVar6 + 1;
        uVar6 = (ulong)uVar4;
      } while (uVar2 != uVar4);
    }
  }
  return bVar1;
}

Assistant:

bool M_LoadJoystickConfig(IJoystickConfig *joy)
{
	char key[32];
	const char *value;
	int axislen;
	int numaxes;

	joy->SetDefaultConfig();
	if (!M_SetJoystickConfigSection(joy, false))
	{
		return false;
	}
	value = GameConfig->GetValueForKey("Sensitivity");
	if (value != NULL)
	{
		joy->SetSensitivity((float)atof(value));
	}
	numaxes = joy->GetNumAxes();
	for (int i = 0; i < numaxes; ++i)
	{
		axislen = mysnprintf(key, countof(key), "Axis%u", i);

		mysnprintf(key + axislen, countof(key) - axislen, "deadzone");
		value = GameConfig->GetValueForKey(key);
		if (value != NULL)
		{
			joy->SetAxisDeadZone(i, (float)atof(value));
		}

		mysnprintf(key + axislen, countof(key) - axislen, "scale");
		value = GameConfig->GetValueForKey(key);
		if (value != NULL)
		{
			joy->SetAxisScale(i, (float)atof(value));
		}

		mysnprintf(key + axislen, countof(key) - axislen, "map");
		value = GameConfig->GetValueForKey(key);
		if (value != NULL)
		{
			EJoyAxis gameaxis = (EJoyAxis)atoi(value);
			if (gameaxis < JOYAXIS_None || gameaxis >= NUM_JOYAXIS)
			{
				gameaxis = JOYAXIS_None;
			}
			joy->SetAxisMap(i, gameaxis);
		}
	}
	return true;
}